

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O0

void __thiscall
Iir::ChebyshevI::AnalogLowPass::design(AnalogLowPass *this,int numPoles,double rippleDb)

{
  int iVar1;
  uint in_ESI;
  LayoutBase *in_RDI;
  PoleZeroPair *in_XMM0_Qa;
  double dVar2;
  complex_t *zero;
  double dVar3;
  LayoutBase *this_00;
  double dVar4;
  double dVar5;
  double b;
  double a;
  int k;
  int i;
  int pairs;
  double n2;
  double cosh_v0;
  double sinh_v0;
  double v0;
  double eps;
  double in_stack_ffffffffffffff50;
  complex<double> local_90;
  double local_78;
  complex<double> local_70;
  double local_60;
  double local_58;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar6;
  undefined4 in_stack_fffffffffffffff0;
  
  if (((in_RDI[1].m_numPoles != in_ESI) || ((double)in_RDI[1].m_pair != (double)in_XMM0_Qa)) ||
     (NAN((double)in_RDI[1].m_pair) || NAN((double)in_XMM0_Qa))) {
    in_RDI[1].m_numPoles = in_ESI;
    in_RDI[1].m_pair = in_XMM0_Qa;
    LayoutBase::reset(in_RDI);
    dVar2 = exp(-(double)in_XMM0_Qa * 0.1 * 2.302585092994046);
    zero = (complex_t *)sqrt(1.0 / dVar2 - 1.0);
    dVar2 = asinh<double>(in_stack_ffffffffffffff50);
    dVar5 = (double)(int)in_ESI;
    dVar3 = sinh(dVar2 / dVar5);
    dVar2 = cosh(dVar2 / dVar5);
    this_00 = (LayoutBase *)(double)(int)(in_ESI << 1);
    iVar1 = (int)in_ESI / 2;
    for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      in_stack_ffffffffffffffb4 = (iVar6 * 2 + 1) - in_ESI;
      local_58 = cos(((double)in_stack_ffffffffffffffb4 * 3.141592653589793) / (double)this_00);
      local_58 = -dVar3 * local_58;
      dVar5 = dVar2;
      dVar4 = sin(((double)in_stack_ffffffffffffffb4 * 3.141592653589793) / (double)this_00);
      dVar5 = dVar5 * dVar4;
      local_60 = dVar5;
      std::complex<double>::complex(&local_70,local_58,dVar5);
      infinity();
      local_78 = dVar5;
      LayoutBase::addPoleZeroConjugatePairs
                ((LayoutBase *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(complex_t *)in_XMM0_Qa,
                 zero);
    }
    if ((in_ESI & 1) == 0) {
      dVar2 = pow(10.0,-(double)in_XMM0_Qa / 20.0);
      LayoutBase::setNormal(in_RDI,0.0,dVar2);
    }
    else {
      std::complex<double>::complex(&local_90,-dVar3,0.0);
      infinity();
      LayoutBase::add(this_00,(complex_t *)CONCAT44(iVar1,iVar6),
                      (complex_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      LayoutBase::setNormal(in_RDI,0.0,1.0);
    }
  }
  return;
}

Assistant:

void AnalogLowPass::design (int numPoles,
                            double rippleDb)
{
  if (m_numPoles != numPoles ||
      m_rippleDb != rippleDb)
  {
    m_numPoles = numPoles;
    m_rippleDb = rippleDb;

    reset ();

    const double eps = std::sqrt (1. / std::exp (-rippleDb * 0.1 * doubleLn10) - 1);
    const double v0 = asinh (1 / eps) / numPoles;
    const double sinh_v0 = -sinh (v0);
    const double cosh_v0 = cosh (v0);

    const double n2 = 2 * numPoles;
    const int pairs = numPoles / 2;
    for (int i = 0; i < pairs; ++i)
    {
      const int k = 2 * i + 1 - numPoles;
      double a = sinh_v0 * cos (k * doublePi / n2);
      double b = cosh_v0 * sin (k * doublePi / n2);

      addPoleZeroConjugatePairs (complex_t (a, b), infinity());
    }

    if (numPoles & 1)
    {
      add (complex_t (sinh_v0, 0), infinity());
      setNormal (0, 1);
    }
    else
    {
      setNormal (0, pow (10, -rippleDb/20.));
    }
  }
}